

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

void __thiscall
pstore::file::file_handle::write_buffer
          (file_handle *this,not_null<const_void_*> buffer,size_t nbytes)

{
  int iVar1;
  void *__buf;
  ssize_t sVar2;
  int *piVar3;
  string local_48;
  int local_24;
  size_t sStack_20;
  int err;
  size_t nbytes_local;
  file_handle *this_local;
  not_null<const_void_*> buffer_local;
  
  sStack_20 = nbytes;
  nbytes_local = (size_t)this;
  this_local = (file_handle *)buffer.ptr_;
  ensure_open(this);
  iVar1 = this->file_;
  __buf = gsl::not_null<const_void_*>::get((not_null<const_void_*> *)&this_local);
  sVar2 = write(iVar1,__buf,sStack_20);
  if (sVar2 == -1) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    local_24 = iVar1;
    path_abi_cxx11_(&local_48,this);
    (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
              (iVar1,"write failed",&local_48);
  }
  if ((this->is_writable_ & 1U) != 0) {
    return;
  }
  assert_failed("is_writable_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file_posix.cpp"
                ,0x140);
}

Assistant:

void file_handle::write_buffer (gsl::not_null<void const *> const buffer,
                                        std::size_t const nbytes) {
            this->ensure_open ();

            if (::write (file_, buffer.get (), nbytes) == -1) {
                int const err = errno;
                raise_file_error (err, "write failed", this->path ());
            }

            // If the write call succeeded, then the file must have been writable!
            PSTORE_ASSERT (is_writable_);
        }